

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O2

bool __thiscall Threading::Event::_Wait(Event *this,TimeOut *rcxTO)

{
  Event EVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  __pthread_cleanup_class __clframe;
  timeval tOut;
  timespec abstime;
  
  __clframe.__cancel_arg = this;
  if (rcxTO->duration == 0) {
    __clframe.__cancel_routine = pthread_mutex_unlock;
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
    if (iVar2 == 0) {
      EVar1 = this[0x29];
      if ((this[0x29] == (Event)0x1) && (this[0x28] == (Event)0x0)) {
        this[0x29] = (Event)0x0;
      }
    }
    else {
      EVar1 = (Event)0x0;
    }
    bVar4 = iVar2 == 0;
  }
  else if (rcxTO->duration == 0xffffffff) {
    __clframe.__cancel_routine = pthread_mutex_unlock;
    __clframe.__do_it = 1;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar2 == 0) {
      if (this[0x29] == (Event)0x0) {
        EVar1 = (Event)0x0;
        while (((byte)EVar1 & 1) == 0) {
          iVar3 = pthread_cond_wait((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this);
          if (iVar3 != 4) {
            if (iVar3 != 0) goto LAB_0010bc7a;
            EVar1 = this[0x29];
          }
        }
      }
      EVar1 = (Event)0x1;
      if (this[0x28] == (Event)0x0) {
        this[0x29] = (Event)0x0;
        EVar1 = (Event)0x1;
      }
    }
    else {
LAB_0010bc7a:
      EVar1 = (Event)0x0;
    }
    bVar4 = iVar2 == 0;
  }
  else {
    gettimeofday((timeval *)&tOut,(__timezone_ptr_t)0x0);
    tOut.tv_usec = (ulong)((rcxTO->duration % 1000) * 1000) + tOut.tv_usec;
    tOut.tv_sec = (ulong)rcxTO->duration / 1000 + tOut.tv_sec;
    if (1000000 < tOut.tv_usec) {
      tOut.tv_sec = tOut.tv_sec + 1;
      tOut.tv_usec = tOut.tv_usec + -1000000;
    }
    abstime.tv_nsec = tOut.tv_usec * 1000;
    __clframe.__cancel_routine = pthread_mutex_unlock;
    __clframe.__do_it = 1;
    abstime.tv_sec = tOut.tv_sec;
    while (bVar4 = stillBefore(&tOut), bVar4) {
      iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
      if (iVar2 == 0) {
        if (this[0x29] != (Event)0x0) goto LAB_0010bd5c;
        EVar1 = (Event)0x0;
        goto LAB_0010bdcb;
      }
      sched_yield();
    }
LAB_0010bdef:
    EVar1 = (Event)0x0;
  }
LAB_0010bdfd:
  __clframe.__do_it = (int)bVar4;
  __pthread_cleanup_class::~__pthread_cleanup_class(&__clframe);
  return (bool)EVar1;
LAB_0010bdcb:
  if (((byte)EVar1 & 1) != 0) goto LAB_0010bd5c;
  iVar2 = 4;
  while (iVar2 == 4) {
    iVar2 = pthread_cond_timedwait
                      ((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this,(timespec *)&abstime)
    ;
  }
  if (iVar2 != 0) goto LAB_0010bdef;
  EVar1 = this[0x29];
  goto LAB_0010bdcb;
LAB_0010bd5c:
  EVar1 = (Event)0x1;
  if (this[0x28] == (Event)0x0) {
    this[0x29] = (Event)0x0;
    EVar1 = (Event)0x1;
  }
  goto LAB_0010bdfd;
}

Assistant:

bool Threading::Event::_Wait(const TimeOut & rcxTO) volatile
{
  #ifndef _POSIX
    bool isOkay = false;
    // compute time delay
    portTickType  tickDelay = rcxTO == Infinite ? portMAX_DELAY : (rcxTO == InstantCheck ? 0 : rcxTO / portTICK_RATE_MS);
    portBASE_TYPE  result;
    unsigned portLONG ulVar = 0;

    // The value in the queue must be removed
    if (!manualReset)
    {
        // The queue is automatically freed
        return xQueueReceive(xQueue, &ulVar, tickDelay) == pdTRUE;
    }
    // The queue is not automatically freed
    return xQueuePeek(xQueue, &ulVar, tickDelay) == pdTRUE;
  #else
    bool isOkay = false;
    if (rcxTO == Infinite)
    {
        bool bState = false;
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = pthread_mutex_lock((HMUTEX*)&event), retValue = 0;
        if (mutexLockSuccess == 0)
        {
            bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    // pthread_cond_wait release the mxEvent mutex and
                    // lock the condition atomically
                    // Because if any other thread wants to modify the state
                    // it has to lock the mutex, the change will be protected then
                    if ((retValue = pthread_cond_wait((pthread_cond_t*)&condition, (HMUTEX*)&event)) == EINTR) continue;
                    if (retValue != 0)
                    {   // An error occurred
                        isOkay = false; break;
                    }
                    bState = state;
                }

                if (!retValue)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }

        } // else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
    else if (rcxTO == InstantCheck)
    {
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int retValue = pthread_mutex_trylock((HMUTEX*)&event);
        if (retValue == 0)
        {
            isOkay = state;
            // Is it in auto reset mode ?
            if (state && !manualReset) state = false;

        } //else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(retValue == 0);
        return isOkay;
    }
    else // Wait with time out
    {
        // Process the absolute time for timeout
        struct timespec abstime;
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)(rcxTO % 1000) * 1000;
        tOut.tv_sec += (uint32)rcxTO / 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }
        abstime.tv_sec = tOut.tv_sec;
        abstime.tv_nsec = tOut.tv_usec * 1000;

        // First try to lock the mutex
        // Sadly, we must poll here

        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = -1, retval = 0;
        // Poll to get the mutex
        while (stillBefore(&tOut))
        {
            mutexLockSuccess = pthread_mutex_trylock((HMUTEX*)&event);
            if (mutexLockSuccess == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid polling)
            sched_yield();
        }
        if (mutexLockSuccess == 0)
        {   // We now have the mutex, so check the state
            bool bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {   // Unset here, so wait for the condition
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    retval = EINTR;
                    while (retval == EINTR) retval = pthread_cond_timedwait((pthread_cond_t*)&condition, (HMUTEX*)&event, &abstime);

                    if (retval != 0) //== ETIMEDOUT)
                    {   // No change in the specified time, so release the mutex and return
                        break;
                    }

                    // A thread could have reset a unset state, thus causing condition
                    // broadcasting. We have to make sure the state is good now
                    bState = state;
                }

                if (!retval)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }
        }
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
  #endif
}